

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O0

void anon_unknown.dwarf_17105::loadAirspySource(Airspy *out,Value *v)

{
  bool bVar1;
  return_type_conflict rVar2;
  return_type rVar3;
  reference this;
  return_type *in_RDI;
  Value *value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>
  *it;
  const_iterator __end1;
  const_iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
  *__range1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
  *table;
  Value *in_stack_00000068;
  string *in_stack_00000170;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
  *in_stack_ffffffffffffffa8;
  Value *in_stack_ffffffffffffffb0;
  _Self local_30;
  _Self local_28;
  return_type local_20;
  return_type local_18;
  return_type *local_8;
  
  local_8 = in_RDI;
  local_20 = toml::Value::
             as<std::map<std::__cxx11::string,toml::Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,toml::Value>>>>
                       (in_stack_ffffffffffffffb0);
  local_18 = local_20;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
       ::begin(in_stack_ffffffffffffffa8);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
       ::end(in_stack_ffffffffffffffa8);
  while( true ) {
    bVar1 = std::operator!=(&local_28,&local_30);
    if (!bVar1) break;
    this = std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>
           ::operator*((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>
                        *)0x17b087);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8);
    if (bVar1) {
      rVar3 = toml::Value::as<int>(in_stack_ffffffffffffffb0);
      *local_8 = rVar3;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8);
      if (bVar1) {
        rVar3 = toml::Value::as<int>(in_stack_ffffffffffffffb0);
        local_8[1] = rVar3;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8);
        if (bVar1) {
          rVar3 = toml::Value::as<int>(in_stack_ffffffffffffffb0);
          *(char *)(local_8 + 2) = (char)rVar3;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8);
          if (bVar1) {
            createSamplePublisher(in_stack_00000068);
            std::unique_ptr<SamplePublisher,_std::default_delete<SamplePublisher>_>::operator=
                      ((unique_ptr<SamplePublisher,_std::default_delete<SamplePublisher>_> *)
                       in_stack_ffffffffffffffb0,
                       (unique_ptr<SamplePublisher,_std::default_delete<SamplePublisher>_> *)
                       in_stack_ffffffffffffffa8);
            std::unique_ptr<SamplePublisher,_std::default_delete<SamplePublisher>_>::~unique_ptr
                      ((unique_ptr<SamplePublisher,_std::default_delete<SamplePublisher>_> *)this);
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8);
            if (bVar1) {
              rVar2 = toml::Value::as<bool>(in_stack_ffffffffffffffb0);
              *(return_type_conflict *)((long)local_8 + 9) = rVar2;
            }
            else {
              throwInvalidKey(in_stack_00000170);
            }
          }
        }
      }
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>
                  *)in_stack_ffffffffffffffb0);
  }
  return;
}

Assistant:

void loadAirspySource(Config::Airspy& out, const toml::Value& v) {
  const auto& table = v.as<toml::Table>();
  for (const auto& it : table) {
    const auto& key = it.first;
    const auto& value = it.second;

    if (key == "frequency") {
      out.frequency = value.as<int>();
      continue;
    }

    if (key == "sample_rate") {
      out.sampleRate = value.as<int>();
      continue;
    }

    if (key == "gain") {
      out.gain = value.as<int>();
      continue;
    }

    if (key == "sample_publisher") {
      out.samplePublisher = createSamplePublisher(value);
      continue;
    }

    if (key == "bias_tee") {
      out.bias_tee = value.as<bool>();
      continue;
    }

    throwInvalidKey(key);
  }
}